

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * __thiscall capnp::DynamicValue::Reader::operator=(Reader *this,Reader *other)

{
  SegmentReader *pSVar1;
  SegmentReader *pSVar2;
  undefined4 uVar3;
  long lVar4;
  Reader *pRVar5;
  byte bVar6;
  
  bVar6 = 0;
  if ((this->type == CAPABILITY) &&
     (pSVar1 = (this->field_1).structValue.reader.segment, pSVar1 != (SegmentReader *)0x0)) {
    (this->field_1).textValue.super_StringPtr.content.size_ = 0;
    pSVar2 = (this->field_1).anyPointerValue.reader.segment;
    (*(code *)pSVar2->arena->_vptr_Arena)
              (pSVar2,(long)&pSVar1->arena + (long)pSVar1->arena[-2]._vptr_Arena);
  }
  if (other->type == CAPABILITY) {
    this->type = CAPABILITY;
    (*(code *)((other->field_1).structValue.reader.segment)->arena[4]._vptr_Arena)(&this->field_1);
    (this->field_1).listValue.reader.segment = (other->field_1).listValue.reader.segment;
  }
  else {
    pRVar5 = this;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar3 = *(undefined4 *)&other->field_0x4;
      pRVar5->type = other->type;
      *(undefined4 *)&pRVar5->field_0x4 = uVar3;
      other = (Reader *)((long)other + (ulong)bVar6 * -0x10 + 8);
      pRVar5 = (Reader *)((long)pRVar5 + (ulong)bVar6 * -0x10 + 8);
    }
  }
  return this;
}

Assistant:

DynamicValue::Reader& DynamicValue::Reader::operator=(const Reader& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, other);
  return *this;
}